

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void on_mouse(int event,int x,int y,int flags,void *ustc)

{
  Scalar *pSVar1;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  Scalar_<double> *this;
  double dVar2;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *in_stack_ffffffffffffff60;
  Mat *in_stack_ffffffffffffff68;
  _InputOutputArray *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  undefined1 local_68 [48];
  Point_<int> local_38;
  undefined1 local_30 [36];
  uint local_c;
  uint local_8;
  int local_4;
  
  local_c = in_EDX;
  if ((in_EDI != 1) || (obs_set)) {
    if (obs_set) {
      dVar2 = (double)(int)in_ESI;
      local_4 = in_EDI;
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                         (in_stack_ffffffffffffff60,
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      *pSVar1 = dVar2;
      dVar2 = (double)(int)local_c;
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                         (in_stack_ffffffffffffff60,
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      *pSVar1 = dVar2;
      render_flag = true;
      if (local_4 == 1) {
        printf("Now angle: %.4lf\n",(angle * 180.0) / 3.141592653589793);
      }
    }
  }
  else {
    uVar3 = 0;
    local_8 = in_ESI;
    printf("cv::Point(%d, %d),\n",(ulong)in_ESI,(ulong)in_EDX);
    this = (Scalar_<double> *)(double)(int)local_8;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                       (in_stack_ffffffffffffff60,
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *pSVar1 = (Scalar)this;
    dVar2 = (double)(int)local_c;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                       (in_stack_ffffffffffffff60,
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *pSVar1 = dVar2;
    cv::_InputOutputArray::_InputOutputArray(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    cv::Point_<int>::Point_(&local_38,local_8,local_c);
    cv::Scalar_<double>::Scalar_
              (this,(double)CONCAT44(uVar3,in_stack_ffffffffffffff78),
               (double)in_stack_ffffffffffffff70,(double)in_stack_ffffffffffffff68,
               (double)in_stack_ffffffffffffff60);
    cv::circle(local_30,&local_38,3,local_68,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x141147);
    obs_set = true;
  }
  return;
}

Assistant:

void on_mouse(int event, int x, int y, int flags, void *ustc) {
    if (event == cv::EVENT_LBUTTONDOWN && obs_set == false) {
        printf("cv::Point(%d, %d),\n", x, y);
        obs(0) = double(x);
        obs(1) = double(y);
        cv::circle(src, cv::Point(x, y), 3, cv::Scalar(0, 255, 0), -1);
        obs_set = true;
    } else if (obs_set == true) {
        orient(0) = double(x);
        orient(1) = double(y);
        render_flag = true;
        if (event == cv::EVENT_LBUTTONDOWN) {
            printf("Now angle: %.4lf\n", angle * 180.0 / M_PI);
        }
    } 
}